

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

void __thiscall pbrt::Vector3fi::Vector3fi(Vector3fi *this,Vector3f *p,Vector3f *e)

{
  Interval<float> in_RDX;
  Interval<float> in_RSI;
  undefined8 in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Vector3<pbrt::Interval<float>_> *this_00;
  Interval<float> z;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar1._0_8_ = Interval<float>::FromValueAndError((float)((ulong)in_RDI >> 0x20),(float)in_RDI);
  auVar1._8_56_ = extraout_var;
  z = (Interval<float>)vmovlpd_avx(auVar1._0_16_);
  auVar2._0_8_ = Interval<float>::FromValueAndError((float)((ulong)in_RDI >> 0x20),(float)in_RDI);
  auVar2._8_56_ = extraout_var_00;
  this_00 = (Vector3<pbrt::Interval<float>_> *)vmovlpd_avx(auVar2._0_16_);
  auVar3._0_8_ = Interval<float>::FromValueAndError((float)((ulong)in_RDI >> 0x20),(float)in_RDI);
  auVar3._8_56_ = extraout_var_01;
  vmovlpd_avx(auVar3._0_16_);
  Vector3<pbrt::Interval<float>_>::Vector3(this_00,in_RSI,in_RDX,z);
  return;
}

Assistant:

PBRT_CPU_GPU
    Vector3fi(const Vector3f &p, const Vector3f &e)
        : Vector3<Interval<Float>>(Interval<Float>::FromValueAndError(p.x, e.x),
                                   Interval<Float>::FromValueAndError(p.y, e.y),
                                   Interval<Float>::FromValueAndError(p.z, e.z)) {}